

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O2

void test_base_z5_row_access<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false>>>
               (void)

{
  pointer pvVar1;
  uint rowIndex;
  pointer witness;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_00;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_01;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_02;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_03;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_04;
  allocator_type local_e9;
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_e8;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  rows;
  undefined1 local_a8 [16];
  _Base_ptr local_98;
  _Base_ptr p_Stack_90;
  _Base_ptr local_88;
  size_t sStack_80;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  columns;
  Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>
  m;
  
  build_general_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false>>>>
            ();
  Gudhi::persistence_matrix::
  Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false>>
  ::
  Matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false>>
              *)&m,&columns,5);
  rows.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rows.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  rows.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._0_4_ = 3;
  local_a8._4_4_ = 1;
  local_a8._8_8_ = (pointer)0x100000006;
  local_98 = (_Base_ptr)0x100000009;
  p_Stack_90 = (_Base_ptr)0x10000000a;
  local_88 = (_Base_ptr)0x10000000b;
  __l._M_len = 5;
  __l._M_array = (iterator)local_a8;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&local_e8,__l,&local_e9);
  std::
  vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
  ::
  emplace_back<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
              *)&rows,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)&local_e8);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&local_e8);
  local_a8._0_4_ = 3;
  local_a8._4_4_ = 4;
  local_a8._8_8_ = (pointer)0x100000005;
  local_98 = (_Base_ptr)0x100000008;
  p_Stack_90 = (_Base_ptr)0x400000009;
  local_88 = (_Base_ptr)0x40000000b;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)local_a8;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&local_e8,__l_00,&local_e9);
  std::
  vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
  ::
  emplace_back<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
              *)&rows,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)&local_e8);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&local_e8);
  local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x400000005;
  local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x400000008;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_e8;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)local_a8,__l_01,&local_e9);
  std::
  vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
  ::
  emplace_back<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
              *)&rows,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)local_a8);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)local_a8);
  local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x100000007;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&local_e8;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)local_a8,__l_02,&local_e9);
  std::
  vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
  ::
  emplace_back<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
              *)&rows,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)local_a8);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)local_a8);
  local_a8._0_4_ = 3;
  local_a8._4_4_ = 1;
  local_a8._8_8_ = (pointer)0x400000006;
  local_98 = (_Base_ptr)0x100000007;
  p_Stack_90 = (_Base_ptr)0x100000009;
  local_88 = (_Base_ptr)0x40000000a;
  sStack_80 = 0x10000000b;
  __l_03._M_len = 6;
  __l_03._M_array = (iterator)local_a8;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&local_e8,__l_03,&local_e9);
  std::
  vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
  ::
  emplace_back<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
              *)&rows,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)&local_e8);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&local_e8);
  local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x400000007;
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)&local_e8;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)local_a8,__l_04,&local_e9);
  std::
  vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
  ::
  emplace_back<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
              *)&rows,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)local_a8);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)local_a8);
  pvVar1 = rows.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  rowIndex = 0;
  for (witness = rows.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; witness != pvVar1; witness = witness + 1
      ) {
    get_ordered_row<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false>>>
              ((column_content<typename_Matrix<Base_options_with_row_access<false,_(Column_types)7,_true,_false,_false,_false>_>::Column>
                *)local_a8,&m,rowIndex);
    test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false>>>>
              (witness,(column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>
                        *)local_a8);
    std::
    _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::~_Rb_tree((_Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 *)local_a8);
    rowIndex = rowIndex + 1;
  }
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector(&rows);
  Gudhi::persistence_matrix::
  Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>
  ::~Matrix(&m);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector(&columns);
  return;
}

Assistant:

void test_base_z5_row_access() {
  auto columns = build_general_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  std::vector<std::vector<std::pair<unsigned int, typename Matrix::Element> > > rows;
  if constexpr (Matrix::Option_list::has_column_compression) {
    // if the union find structure changes, the column_index values of the entries could also change. Change the test
    // with all possibilities?
    rows.push_back({{3, 1}, {6, 1}});
    rows.push_back({{3, 4}, {5, 1}});
    rows.push_back({{5, 4}});
    rows.push_back({{7, 1}});
    rows.push_back({{3, 1}, {6, 4}, {7, 1}});
    rows.push_back({{7, 4}});
  } else {
    rows.push_back({{3, 1}, {6, 1}, {9, 1}, {10, 1}, {11, 1}});
    rows.push_back({{3, 4}, {5, 1}, {8, 1}, {9, 4}, {11, 4}});
    rows.push_back({{5, 4}, {8, 4}});
    rows.push_back({{7, 1}});
    rows.push_back({{3, 1}, {6, 4}, {7, 1}, {9, 1}, {10, 4}, {11, 1}});
    rows.push_back({{7, 4}});
  }

  unsigned int i = 0;
  for (auto& r : rows) {
    test_column_equality<typename Matrix::Column>(r, get_ordered_row(m, i++));
  }
}